

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O3

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleMv<4>_>::RefBuilderSmall::
attachBuildRefs(RefBuilderSmall *this,
               BVHNBuilderTwoLevel<4,_embree::TriangleMesh,_embree::TriangleM<4>_> *topBuilder)

{
  FastAllocator *this_00;
  atomic<unsigned_long> *paVar1;
  pointer *pppTVar2;
  atomic<int> *paVar3;
  undefined4 *puVar4;
  undefined4 *puVar5;
  long *plVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  Geometry *pGVar12;
  BVH *pBVar13;
  ThreadLocal2 *pTVar14;
  iterator __position;
  Ref<embree::Geometry> *pRVar15;
  long lVar16;
  RTCFilterFunctionN p_Var17;
  BuildRef *pBVar18;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar19;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined8 uVar25;
  ThreadLocal2 *this_01;
  ulong uVar26;
  undefined1 (*pauVar27) [16];
  ulong uVar28;
  long lVar29;
  ulong uVar30;
  float *pfVar31;
  long lVar32;
  size_t sVar33;
  ulong uVar34;
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  undefined1 auVar35 [64];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 in_ZMM2 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vuint<4> vgeomID;
  Lock<embree::MutexSys> lock;
  vuint<4> vprimID;
  PrimInfo pinfo;
  undefined1 local_178 [16];
  undefined1 local_160 [16];
  undefined1 local_150 [16];
  PrimRef *local_140;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_138;
  char cStack_130;
  undefined7 uStack_12f;
  undefined1 auStack_128 [16];
  undefined1 auStack_118 [16];
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_108;
  char cStack_100;
  undefined7 uStack_ff;
  undefined1 auStack_f8 [16];
  undefined1 auStack_e8 [16];
  RefBuilderSmall *local_d8;
  long *local_d0;
  _Head_base<0UL,_embree::FastAllocator::ThreadLocal2_*,_false> local_c8;
  undefined8 uStack_c0;
  undefined1 auStack_b8 [16];
  undefined1 auStack_a8 [16];
  undefined1 local_98 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_88;
  undefined1 local_78 [16];
  long local_48;
  long local_40;
  
  sVar33 = this->objectID_;
  pGVar12 = (topBuilder->scene->geometries).items[sVar33].ptr;
  uVar8 = pGVar12->numPrimitives;
  uVar34 = CONCAT44(0,uVar8);
  lVar29 = *(long *)&(topBuilder->scene->super_AccelN).field_0x188;
  local_160._0_8_ = lVar29 + 0x550;
  if (lVar29 == 0) {
    local_160._0_8_ = (MemoryMonitorInterface *)0x0;
  }
  local_160[8] = false;
  local_150 = (undefined1  [16])0x0;
  local_140 = (PrimRef *)0x0;
  local_d8 = this;
  if (uVar34 != 0) {
    sVar33 = uVar34 << 5;
    (**((MemoryMonitorInterface *)local_160._0_8_)->_vptr_MemoryMonitorInterface)
              (local_160._0_8_,sVar33,0);
    if (uVar8 < 0xe0000) {
      local_140 = (PrimRef *)alignedMalloc(sVar33,0x20);
    }
    else {
      local_140 = (PrimRef *)os_malloc(sVar33,(bool *)(local_160 + 8));
    }
    local_150._8_4_ = uVar8;
    local_150._0_8_ = uVar34;
    local_150._12_4_ = 0;
    sVar33 = local_d8->objectID_;
  }
  avx::createPrimRefArray
            ((PrimInfo *)&local_88.field_1,pGVar12,(uint)sVar33,uVar34,(mvector<PrimRef> *)local_160
             ,&(topBuilder->bvh->scene->progressInterface).super_BuildProgressMonitor);
  if (local_40 != local_48) {
    local_d0 = (long *)__tls_get_addr(&PTR_021a7d38);
    auVar35._8_56_ = extraout_var;
    auVar35._0_8_ = extraout_XMM0_Qa;
    uVar34 = 0;
    do {
      auVar37 = in_ZMM2._0_16_;
      auVar36 = auVar35._0_16_;
      pBVar13 = topBuilder->bvh;
      this_01 = (ThreadLocal2 *)*local_d0;
      if (this_01 == (ThreadLocal2 *)0x0) {
        this_01 = (ThreadLocal2 *)alignedMalloc(0xc0,0x40);
        MutexSys::MutexSys((MutexSys *)this_01);
        (this_01->alloc)._M_b._M_p = (__pointer_type)0x0;
        (this_01->alloc0).parent = this_01;
        (this_01->alloc0).ptr = (char *)0x0;
        (this_01->alloc0).cur = 0;
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).end = 0;
        (this_01->alloc0).allocBlockSize = 0;
        (this_01->alloc0).bytesUsed = 0;
        (this_01->alloc0).bytesWasted = 0;
        (this_01->alloc1).parent = this_01;
        (this_01->alloc1).ptr = (char *)0x0;
        (this_01->alloc1).cur = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).end = 0;
        (this_01->alloc1).allocBlockSize = 0;
        (this_01->alloc1).bytesUsed = 0;
        (this_01->alloc1).bytesWasted = 0;
        *local_d0 = (long)this_01;
        local_138._M_head_impl = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
        cStack_130 = '\x01';
        auVar36 = (undefined1  [16])0x0;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        local_108._M_head_impl = this_01;
        std::
        vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
        ::
        emplace_back<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>
                  ((vector<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>,std::allocator<std::unique_ptr<embree::FastAllocator::ThreadLocal2,std::default_delete<embree::FastAllocator::ThreadLocal2>>>>
                    *)FastAllocator::s_thread_local_allocators,
                   (unique_ptr<embree::FastAllocator::ThreadLocal2,_std::default_delete<embree::FastAllocator::ThreadLocal2>_>
                    *)&local_108);
        if (local_108._M_head_impl != (ThreadLocal2 *)0x0) {
          std::default_delete<embree::FastAllocator::ThreadLocal2>::operator()
                    ((default_delete<embree::FastAllocator::ThreadLocal2> *)&local_108,
                     local_108._M_head_impl);
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
      }
      this_00 = &pBVar13->alloc;
      uVar28 = (ulong)(((pBVar13->alloc).use_single_mode ^ 1) << 6);
      local_178._0_8_ = 0xb0;
      pTVar14 = *(ThreadLocal2 **)((long)&(this_01->alloc0).parent + uVar28);
      if (this_00 != (pTVar14->alloc)._M_b._M_p) {
        cStack_100 = '\x01';
        local_108._M_head_impl = pTVar14;
        MutexSys::lock(&pTVar14->mutex);
        if ((pTVar14->alloc)._M_b._M_p != (__pointer_type)0x0) {
          LOCK();
          paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesUsed;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (pTVar14->alloc1).bytesUsed + (pTVar14->alloc0).bytesUsed;
          UNLOCK();
          LOCK();
          paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesFree;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (((pTVar14->alloc0).end + (pTVar14->alloc1).end) -
               ((pTVar14->alloc0).cur + (pTVar14->alloc1).cur));
          UNLOCK();
          LOCK();
          paVar1 = &((pTVar14->alloc)._M_b._M_p)->bytesWasted;
          (paVar1->super___atomic_base<unsigned_long>)._M_i =
               (paVar1->super___atomic_base<unsigned_long>)._M_i +
               (pTVar14->alloc1).bytesWasted + (pTVar14->alloc0).bytesWasted;
          UNLOCK();
        }
        (pTVar14->alloc0).end = 0;
        (pTVar14->alloc0).allocBlockSize = 0;
        (pTVar14->alloc0).bytesUsed = 0;
        (pTVar14->alloc0).bytesWasted = 0;
        (pTVar14->alloc0).ptr = (char *)0x0;
        (pTVar14->alloc0).cur = 0;
        (pTVar14->alloc0).end = 0;
        (pTVar14->alloc0).allocBlockSize = 0;
        (pTVar14->alloc0).allocBlockSize = (pBVar13->alloc).defaultBlockSize;
        (pTVar14->alloc1).ptr = (char *)0x0;
        (pTVar14->alloc1).cur = 0;
        (pTVar14->alloc1).end = 0;
        (pTVar14->alloc1).allocBlockSize = 0;
        (pTVar14->alloc1).end = 0;
        (pTVar14->alloc1).allocBlockSize = 0;
        (pTVar14->alloc1).bytesUsed = 0;
        (pTVar14->alloc1).bytesWasted = 0;
        (pTVar14->alloc1).allocBlockSize = (pBVar13->alloc).defaultBlockSize;
        LOCK();
        (pTVar14->alloc)._M_b._M_p = this_00;
        UNLOCK();
        local_138._M_head_impl = (ThreadLocal2 *)&FastAllocator::s_thread_local_allocators_lock;
        cStack_130 = '\x01';
        auVar36 = (undefined1  [16])0x0;
        local_c8._M_head_impl = pTVar14;
        MutexSys::lock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        __position._M_current =
             (pBVar13->alloc).thread_local_allocators.
             super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (pBVar13->alloc).thread_local_allocators.
            super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
          ::_M_realloc_insert<embree::FastAllocator::ThreadLocal2*const&>
                    ((vector<embree::FastAllocator::ThreadLocal2*,std::allocator<embree::FastAllocator::ThreadLocal2*>>
                      *)&(pBVar13->alloc).thread_local_allocators,__position,&local_c8._M_head_impl)
          ;
        }
        else {
          *__position._M_current = local_c8._M_head_impl;
          pppTVar2 = &(pBVar13->alloc).thread_local_allocators.
                      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppTVar2 = *pppTVar2 + 1;
        }
        MutexSys::unlock((MutexSys *)&FastAllocator::s_thread_local_allocators_lock);
        if (cStack_100 == '\x01') {
          MutexSys::unlock(&(local_108._M_head_impl)->mutex);
        }
      }
      plVar6 = (long *)((long)&(this_01->alloc0).bytesUsed + uVar28);
      *plVar6 = *plVar6 + local_178._0_8_;
      lVar29 = *(long *)((long)&(this_01->alloc0).cur + uVar28);
      uVar30 = (ulong)(-(int)lVar29 & 0xf);
      uVar26 = lVar29 + local_178._0_8_ + uVar30;
      *(ulong *)((long)&(this_01->alloc0).cur + uVar28) = uVar26;
      if (*(ulong *)((long)&(this_01->alloc0).end + uVar28) < uVar26) {
        *(long *)((long)&(this_01->alloc0).cur + uVar28) = lVar29;
        pTVar14 = *(ThreadLocal2 **)((long)&(this_01->alloc0).allocBlockSize + uVar28);
        if (pTVar14 < (ThreadLocal2 *)(local_178._0_8_ << 2)) {
          pauVar27 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)local_178);
        }
        else {
          local_138._M_head_impl = pTVar14;
          pauVar27 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_138);
          *(undefined1 (**) [16])((long)&(this_01->alloc0).ptr + uVar28) = pauVar27;
          lVar29 = (*(long *)((long)&(this_01->alloc0).end + uVar28) -
                   *(long *)((long)&(this_01->alloc0).cur + uVar28)) +
                   *(long *)((long)&(this_01->alloc0).bytesWasted + uVar28);
          *(long *)((long)&(this_01->alloc0).bytesWasted + uVar28) = lVar29;
          *(undefined8 *)((long)&(this_01->alloc0).cur + uVar28) = 0;
          *(ThreadLocal2 **)((long)&(this_01->alloc0).end + uVar28) = local_138._M_head_impl;
          *(undefined8 *)((long)&(this_01->alloc0).cur + uVar28) = local_178._0_8_;
          if (local_138._M_head_impl < (ulong)local_178._0_8_) {
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar28) = 0;
            local_138._M_head_impl =
                 *(ThreadLocal2 **)((long)&(this_01->alloc0).allocBlockSize + uVar28);
            pauVar27 = (undefined1 (*) [16])FastAllocator::malloc(this_00,(size_t)&local_138);
            *(undefined1 (**) [16])((long)&(this_01->alloc0).ptr + uVar28) = pauVar27;
            lVar29 = (*(long *)((long)&(this_01->alloc0).end + uVar28) -
                     *(long *)((long)&(this_01->alloc0).cur + uVar28)) +
                     *(long *)((long)&(this_01->alloc0).bytesWasted + uVar28);
            *(long *)((long)&(this_01->alloc0).bytesWasted + uVar28) = lVar29;
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar28) = 0;
            *(ThreadLocal2 **)((long)&(this_01->alloc0).end + uVar28) = local_138._M_head_impl;
            *(undefined8 *)((long)&(this_01->alloc0).cur + uVar28) = local_178._0_8_;
            if (local_138._M_head_impl < (ulong)local_178._0_8_) {
              *(undefined8 *)((long)&(this_01->alloc0).cur + uVar28) = 0;
              pauVar27 = (undefined1 (*) [16])0x0;
              goto LAB_013aabf8;
            }
          }
          *(long *)((long)&(this_01->alloc0).bytesWasted + uVar28) = lVar29;
        }
      }
      else {
        plVar6 = (long *)((long)&(this_01->alloc0).bytesWasted + uVar28);
        *plVar6 = *plVar6 + uVar30;
        pauVar27 = (undefined1 (*) [16])
                   ((uVar26 - local_178._0_8_) + *(long *)((long)&(this_01->alloc0).ptr + uVar28));
      }
LAB_013aabf8:
      uVar28 = local_40 - local_48;
      local_178 = vpcmpeqd_avx(auVar36,auVar36);
      local_138._M_head_impl = (ThreadLocal2 *)0x0;
      auStack_118 = (undefined1  [16])0x0;
      cStack_130 = '\0';
      uStack_12f = 0;
      auStack_128 = (undefined1  [16])0x0;
      auStack_e8 = (undefined1  [16])0x0;
      auStack_f8 = (undefined1  [16])0x0;
      auStack_a8 = (undefined1  [16])0x0;
      uStack_c0 = 0;
      auStack_b8 = (undefined1  [16])0x0;
      auVar36 = ZEXT416(0) << 0x40;
      local_108._M_head_impl = local_138._M_head_impl;
      cStack_100 = cStack_130;
      uStack_ff = uStack_12f;
      local_c8._M_head_impl = local_138._M_head_impl;
      local_98 = local_178;
      if (uVar34 < uVar28) {
        pRVar15 = (topBuilder->bvh->scene->geometries).items;
        pfVar31 = local_140[uVar34].upper.field_0.m128 + 3;
        uVar26 = 0;
        do {
          fVar9 = pfVar31[-4];
          fVar10 = *pfVar31;
          pGVar12 = pRVar15[(uint)fVar9].ptr;
          lVar32 = (ulong)(uint)fVar10 *
                   pGVar12[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
          lVar29 = *(long *)&pGVar12->field_0x58;
          lVar16 = *(long *)&pGVar12[1].time_range.upper;
          p_Var17 = pGVar12[1].intersectionFilterN;
          puVar4 = (undefined4 *)(lVar16 + (ulong)*(uint *)(lVar29 + lVar32) * (long)p_Var17);
          uVar11 = puVar4[1];
          uVar21 = puVar4[2];
          auVar36 = *(undefined1 (*) [16])
                     (lVar16 + (ulong)*(uint *)(lVar29 + 4 + lVar32) * (long)p_Var17);
          puVar5 = (undefined4 *)(lVar16 + (ulong)*(uint *)(lVar29 + 8 + lVar32) * (long)p_Var17);
          uVar22 = *puVar5;
          uVar23 = puVar5[1];
          uVar24 = puVar5[2];
          *(undefined4 *)((long)&local_138._M_head_impl + uVar26 * 4) = *puVar4;
          *(undefined4 *)(auStack_128 + uVar26 * 4) = uVar11;
          *(undefined4 *)(auStack_118 + uVar26 * 4) = uVar21;
          *(int *)((long)&local_108._M_head_impl + uVar26 * 4) = auVar36._0_4_;
          uVar11 = vextractps_avx(auVar36,1);
          *(undefined4 *)(auStack_f8 + uVar26 * 4) = uVar11;
          uVar11 = vextractps_avx(auVar36,2);
          *(undefined4 *)(auStack_e8 + uVar26 * 4) = uVar11;
          *(undefined4 *)((long)&local_c8._M_head_impl + uVar26 * 4) = uVar22;
          *(undefined4 *)(auStack_b8 + uVar26 * 4) = uVar23;
          *(undefined4 *)(auStack_a8 + uVar26 * 4) = uVar24;
          *(float *)(local_178 + uVar26 * 4) = fVar9;
          *(float *)(local_98 + uVar26 * 4) = fVar10;
          uVar30 = uVar26 + 1;
          if (2 < uVar26) break;
          lVar29 = uVar26 + uVar34;
          pfVar31 = pfVar31 + 8;
          uVar26 = uVar30;
        } while (lVar29 + 1U < uVar28);
        auVar45[8] = cStack_130;
        auVar45._0_8_ = local_138._M_head_impl;
        auVar45._9_7_ = uStack_12f;
        auVar42[8] = cStack_100;
        auVar42._0_8_ = local_108._M_head_impl;
        auVar42._9_7_ = uStack_ff;
        auVar39._8_8_ = uStack_c0;
        auVar39._0_8_ = local_c8._M_head_impl;
        uVar34 = uVar34 + uVar30;
        auVar37 = local_178;
        auVar38 = auStack_b8;
        auVar40 = auStack_e8;
        auVar41 = auStack_f8;
        auVar43 = auStack_118;
        auVar44 = auStack_128;
        auVar36 = auStack_a8;
      }
      else {
        auVar37 = vpcmpeqd_avx(auVar37,auVar37);
        auVar38 = ZEXT816(0) << 0x40;
        auVar39 = ZEXT816(0) << 0x40;
        auVar40 = ZEXT816(0) << 0x40;
        auVar41 = ZEXT816(0) << 0x40;
        auVar42 = ZEXT816(0) << 0x40;
        auVar43 = ZEXT816(0) << 0x40;
        auVar44 = ZEXT816(0) << 0x40;
        auVar45 = ZEXT816(0) << 0x40;
      }
      in_ZMM2 = ZEXT1664(auVar37);
      auVar45 = vmovntps_avx(auVar45);
      *pauVar27 = auVar45;
      auVar45 = vmovntps_avx(auVar44);
      pauVar27[1] = auVar45;
      auVar45 = vmovntps_avx(auVar43);
      pauVar27[2] = auVar45;
      auVar45 = vmovntps_avx(auVar42);
      pauVar27[3] = auVar45;
      auVar45 = vmovntps_avx(auVar41);
      pauVar27[4] = auVar45;
      auVar45 = vmovntps_avx(auVar40);
      pauVar27[5] = auVar45;
      auVar45 = vmovntps_avx(auVar39);
      pauVar27[6] = auVar45;
      auVar45 = vmovntps_avx(auVar38);
      pauVar27[7] = auVar45;
      auVar36 = vmovntps_avx(auVar36);
      pauVar27[8] = auVar36;
      auVar36 = vmovntdq_avx(auVar37);
      pauVar27[9] = auVar36;
      auVar36 = vmovntdq_avx(local_98);
      pauVar27[10] = auVar36;
      aVar19.m128 = (__m128)vinsertps_avx(local_88.m128,ZEXT416((uint)local_d8->objectID_),0x30);
      auVar35 = ZEXT1664((undefined1  [16])aVar19);
      aVar20 = (anon_union_16_2_47237d3f_for_Vec3fx_0)vinsertps_avx(local_78,ZEXT416(1),0x30);
      LOCK();
      paVar3 = &topBuilder->nextRef;
      iVar7 = (paVar3->super___atomic_base<int>)._M_i;
      (paVar3->super___atomic_base<int>)._M_i = (paVar3->super___atomic_base<int>)._M_i + 1;
      UNLOCK();
      pBVar18 = (topBuilder->refs).items;
      pBVar18[iVar7].super_PrimRef.upper.field_0 = aVar20;
      pBVar18[iVar7].super_PrimRef.lower.field_0 = aVar19;
      pBVar18[iVar7].node.ptr = (ulong)pauVar27 | 9;
      pBVar18[iVar7].bounds_area = 0.0;
    } while (uVar34 < (ulong)(local_40 - local_48));
  }
  uVar25 = local_150._8_8_;
  if (local_140 != (PrimRef *)0x0) {
    if ((ulong)(local_150._8_8_ << 5) < 0x1c00000) {
      alignedFree(local_140);
    }
    else {
      os_free(local_140,local_150._8_8_ << 5,local_160[8]);
    }
  }
  if (uVar25 != 0) {
    (***(_func_int ***)local_160._0_8_)(local_160._0_8_,uVar25 * -0x20,1);
  }
  return;
}

Assistant:

void attachBuildRefs (BVHNBuilderTwoLevel* topBuilder) {

          Mesh* mesh = topBuilder->scene->template getSafe<Mesh>(objectID_);
          size_t meshSize = mesh->size();
          assert(isSmallGeometry(mesh));
          
          mvector<PrimRef> prefs(topBuilder->scene->device, meshSize);
          auto pinfo = createPrimRefArray(mesh,objectID_,meshSize,prefs,topBuilder->bvh->scene->progressInterface);

          size_t begin=0;
          while (begin < pinfo.size())
          {
            Primitive* accel = (Primitive*) topBuilder->bvh->alloc.getCachedAllocator().malloc1(sizeof(Primitive),BVH::byteAlignment);
            typename BVH::NodeRef node = BVH::encodeLeaf((char*)accel,1);
            accel->fill(prefs.data(),begin,pinfo.size(),topBuilder->bvh->scene);
            
            /* create build primitive */
#if ENABLE_DIRECT_SAH_MERGE_BUILDER
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node,(unsigned int)objectID_,1);
#else
            topBuilder->refs[topBuilder->nextRef++] = BVHNBuilderTwoLevel::BuildRef(pinfo.geomBounds,node);
#endif
          }
          assert(begin == pinfo.size());
        }